

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiPassResourceTracker::registerTexture
          (QRhiPassResourceTracker *this,QRhiTexture *tex,TextureAccess *access,TextureStage *stage,
          UsageState *state)

{
  bool bVar1;
  TextureStage TVar2;
  Texture *pTVar3;
  char *pcVar4;
  TextureStage *in_RCX;
  TextureAccess *in_RDX;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  Texture t;
  QByteArray name;
  iterator it;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  iterator *in_stack_ffffffffffffff40;
  int line;
  QMessageLogger *in_stack_ffffffffffffff50;
  char local_68 [32];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  piter local_30;
  piter local_20;
  iterator *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d = (Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_10 = in_RSI;
  local_20 = (piter)QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::find
                              ((QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture> *)
                               in_stack_ffffffffffffff40,
                               (QRhiTexture **)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_30 = (piter)QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::end
                              ((QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture> *)in_RDI);
  bVar1 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator!=
                    (in_RDI,in_stack_ffffffffffffff40);
  if (bVar1) {
    pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                       ((iterator *)0x698b0a);
    if (pTVar3->access != *in_RDX) {
      pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                         ((iterator *)0x698b26);
      bVar1 = isImageLoadStore(pTVar3->access);
      if ((bVar1) && (bVar1 = isImageLoadStore(*in_RDX), bVar1)) {
        pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                           ((iterator *)0x698b52);
        pTVar3->access = TexStorageLoadStore;
        pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                           ((iterator *)0x698b65);
        *in_RDX = pTVar3->access;
      }
      else {
        line = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        QRhiResource::name((QRhiResource *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff50,(char *)in_RDI,line,
                   (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        pcVar4 = QByteArray::constData((QByteArray *)0x698be2);
        QMessageLogger::warning
                  (local_68,
                   "Texture %p (%s) used with different accesses within the same pass, this is not allowed."
                   ,local_10,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x698c0a);
        in_stack_ffffffffffffff40 = local_10;
      }
    }
    pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                       ((iterator *)0x698c19);
    if (pTVar3->stage != *in_RCX) {
      QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                ((iterator *)0x698c32);
      TVar2 = earlierStage((TextureStage)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                           (TextureStage)in_stack_ffffffffffffff40);
      pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                         ((iterator *)0x698c52);
      pTVar3->stage = TVar2;
      pTVar3 = QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::iterator::operator->
                         ((iterator *)0x698c66);
      *in_RCX = pTVar3->stage;
    }
  }
  else {
    QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture>::insert
              ((QHash<QRhiTexture_*,_QRhiPassResourceTracker::Texture> *)in_stack_ffffffffffffff40,
               (QRhiTexture **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (Texture *)0x698cd9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiPassResourceTracker::registerTexture(QRhiTexture *tex, TextureAccess *access, TextureStage *stage,
                                              const UsageState &state)
{
    auto it = m_textures.find(tex);
    if (it != m_textures.end()) {
        if (it->access != *access) {
            // Different subresources of a texture may be used for both load
            // and store in the same pass. (think reading from one mip level
            // and writing to another one in a compute shader) This we can
            // handle by treating the entire resource as read-write.
            if (isImageLoadStore(it->access) && isImageLoadStore(*access)) {
                it->access = QRhiPassResourceTracker::TexStorageLoadStore;
                *access = it->access;
            } else {
                const QByteArray name = tex->name();
                qWarning("Texture %p (%s) used with different accesses within the same pass, this is not allowed.",
                         tex, name.constData());
            }
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Texture t;
    t.access = *access;
    t.stage = *stage;
    t.stateAtPassBegin = state; // first use -> initial state
    m_textures.insert(tex, t);
}